

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O0

int cmp(void *param_1,void *param_2)

{
  str *a2;
  str *a1;
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  if (*param_1 < *param_2 || *param_1 == *param_2) {
    if (*param_2 <= *param_1) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int cmp(const void *a, const void *b)
{
    struct str *a1 = (struct str *)a;
    struct str *a2 = (struct str *)b;
    if ((*a1).value > (*a2).value)
        return 1;
    else if ((*a1).value < (*a2).value)
        return -1;
    else
        return 0;
}